

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *this,string *id,
          FluctuatingAtypeParameters *data)

{
  string *in_RDX;
  GenericData *in_RSI;
  FluctuatingAtypeParameters *in_RDI;
  FluctuatingAtypeParameters *in_stack_ffffffffffffffc8;
  
  GenericData::GenericData(in_RSI,in_RDX);
  in_RDI->chargeMass = (RealType)&PTR__SimpleTypeData_0037e100;
  FluctuatingAtypeParameters::FluctuatingAtypeParameters(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}